

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

void __thiscall bwtil::IndexedBWT::sampleSA(IndexedBWT *this,bool verbose)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  byte in_SIL;
  IndexedBWT *in_RDI;
  uint last_perc;
  uint perc;
  ulint j;
  ulint i;
  ulint in_stack_ffffffffffffff98;
  packed_view_t *index;
  succinct_bitvector *in_stack_ffffffffffffffa0;
  ulint in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb8 [16];
  reference in_stack_ffffffffffffffc8;
  uint local_28;
  ulint local_18;
  
  local_18 = in_RDI->n;
  local_28 = 1;
  if ((in_SIL & 1) != 0) {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  while (local_18 = local_18 - 1, local_18 != 0) {
    uVar1 = (uint)(((in_RDI->n - local_18) * 100) / in_RDI->n);
    if ((((in_SIL & 1) != 0) && (uVar1 % 10 == 0)) && (uVar1 != local_28)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"   ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
      std::operator<<(poVar3,"% done.\n");
      local_28 = uVar1;
    }
    uVar2 = succinct_bitvector::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (uVar2 == 1) {
      in_stack_ffffffffffffffa0 = (succinct_bitvector *)&in_RDI->text_pointers;
      in_stack_ffffffffffffffa8 = local_18;
      succinct_bitvector::rank1
                ((succinct_bitvector *)in_stack_ffffffffffffffc8._v,in_stack_ffffffffffffffb8._8_8_)
      ;
      in_stack_ffffffffffffffc8 =
           bv::internal::packed_view<std::vector>::operator[]
                     ((packed_view<std::vector> *)in_stack_ffffffffffffffa0,
                      in_stack_ffffffffffffff98);
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    LF(in_RDI,in_stack_ffffffffffffffa8);
  }
  index = &in_RDI->text_pointers;
  succinct_bitvector::rank1
            ((succinct_bitvector *)in_stack_ffffffffffffffc8._v,in_stack_ffffffffffffffb8._8_8_);
  bv::internal::packed_view<std::vector>::operator[]
            ((packed_view<std::vector> *)in_stack_ffffffffffffffa0,(size_t)index);
  bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
            ((item_reference<bv::internal::packed_view<std::vector>_> *)in_stack_ffffffffffffffa0,
             (value_type)index);
  return;
}

Assistant:

void sampleSA(bool verbose){//sample Suffix Array pointers (1 every offrate positions on text). Vector marked_positions must be already computed!

		ulint i=n-1;//current position on text
		ulint j=0;  //current position on the BWT (0=terminator position on the F column)
		uint perc;
		uint last_perc=1;

		if(verbose) cout << endl;

		while(i>0){

			perc = (100*(n-i))/n;

			if(verbose)
				if(perc%10==0 and perc!= last_perc){

					cout << "   " << perc << "% done.\n";
					last_perc=perc;

				}

			if(marked_positions.at(j)==1)
				text_pointers[marked_positions.rank1(j)] = i;

			j = LF(j);
			i--;

		}

		//i=0
		text_pointers[marked_positions.rank1(j)] = 0;

	}